

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::Mock::ClearDefaultActionsLocked(void *mock_obj)

{
  size_type sVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  key_type *in_RSI;
  
  internal::MutexBase::AssertHeld((MutexBase *)internal::g_gmock_mutex);
  sVar1 = std::
          map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
          ::count((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                   *)&stack0xffffffffffffffe8,in_RSI);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
             ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                           *)&stack0xffffffffffffffe8,in_RSI);
    for (p_Var3 = (pmVar2->function_mockers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(pmVar2->function_mockers)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      (**(code **)(**(long **)(p_Var3 + 1) + 0x18))();
    }
  }
  return;
}

Assistant:

void Mock::ClearDefaultActionsLocked(void* mock_obj) {
  internal::g_gmock_mutex.AssertHeld();

  if (g_mock_object_registry.states().count(mock_obj) == 0) {
    // No ON_CALL() was set on the given mock object.
    return;
  }

  // Clears the default actions for each mock method in the given mock
  // object.
  FunctionMockers& mockers =
      g_mock_object_registry.states()[mock_obj].function_mockers;
  for (FunctionMockers::const_iterator it = mockers.begin();
       it != mockers.end(); ++it) {
    (*it)->ClearDefaultActionsLocked();
  }

  // We don't clear the content of mockers, as they may still be
  // needed by VerifyAndClearExpectationsLocked().
}